

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufref.c
# Opt level: O0

void Curl_bufref_set(bufref *br,void *ptr,size_t len,_func_void_void_ptr *dtor)

{
  _func_void_void_ptr *dtor_local;
  size_t len_local;
  void *ptr_local;
  bufref *br_local;
  
  Curl_bufref_free(br);
  br->ptr = (uchar *)ptr;
  br->len = len;
  br->dtor = dtor;
  return;
}

Assistant:

void Curl_bufref_set(struct bufref *br, const void *ptr, size_t len,
                     void (*dtor)(void *))
{
  DEBUGASSERT(ptr || !len);
  DEBUGASSERT(len <= CURL_MAX_INPUT_LENGTH);

  Curl_bufref_free(br);
  br->ptr = (const unsigned char *) ptr;
  br->len = len;
  br->dtor = dtor;
}